

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  int32_t iVar2;
  FILE *local_280;
  FILE *local_278;
  FILE *local_270;
  FILE *local_268;
  FILE *local_260;
  FILE *local_258;
  FILE *local_250;
  FILE *local_248;
  FILE *local_240;
  FILE *local_238;
  FILE *local_230;
  FILE *local_228;
  FILE *local_220;
  FILE *local_218;
  FILE *local_210;
  FILE *local_208;
  FILE *local_200;
  FILE *local_1f8;
  FILE *local_1f0;
  FILE *local_1e8;
  FILE *local_1e0;
  FILE *local_1d8;
  FILE *local_1d0;
  FILE *local_1c8;
  FILE *local_1c0;
  FILE *local_1b8;
  FILE *local_1b0;
  FILE *local_1a8;
  FILE *local_1a0;
  FILE *local_198;
  FILE *local_190;
  FILE *local_188;
  FILE *local_180;
  FILE *local_178;
  FILE *local_170;
  FILE *local_168;
  FILE *local_160;
  FILE *local_158;
  FILE *local_150;
  FILE *local_148;
  FILE *local_140;
  FILE *local_138;
  FILE *local_130;
  FILE *local_128;
  FILE *local_120;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  FILE *local_f8;
  FILE *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  FILE *local_d8;
  FILE *local_d0;
  FILE *local_c8;
  FILE *local_c0;
  FILE *local_b8;
  FILE *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  FILE *local_98;
  FILE *local_90;
  FILE *local_88;
  FILE *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  FILE *local_40;
  FILE *local_38;
  FILE *local_30;
  FILE *local_28;
  int local_1c;
  int reserved_zero_2bits;
  int i;
  bs_t *b_local;
  sps_t *sps_local;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = (FILE *)h264_dbgfile;
  }
  fprintf(local_28,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u8(b);
  sps->profile_idc = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_30 = _stdout;
  }
  else {
    local_30 = (FILE *)h264_dbgfile;
  }
  fprintf(local_30,"sps->profile_idc: %d \n",(ulong)(uint)sps->profile_idc);
  if (h264_dbgfile == (FILE *)0x0) {
    local_38 = _stdout;
  }
  else {
    local_38 = (FILE *)h264_dbgfile;
  }
  fprintf(local_38,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set0_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_40 = _stdout;
  }
  else {
    local_40 = (FILE *)h264_dbgfile;
  }
  fprintf(local_40,"sps->constraint_set0_flag: %d \n",(ulong)(uint)sps->constraint_set0_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_48 = _stdout;
  }
  else {
    local_48 = (FILE *)h264_dbgfile;
  }
  fprintf(local_48,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set1_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_50 = _stdout;
  }
  else {
    local_50 = (FILE *)h264_dbgfile;
  }
  fprintf(local_50,"sps->constraint_set1_flag: %d \n",(ulong)(uint)sps->constraint_set1_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_58 = _stdout;
  }
  else {
    local_58 = (FILE *)h264_dbgfile;
  }
  fprintf(local_58,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set2_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_60 = _stdout;
  }
  else {
    local_60 = (FILE *)h264_dbgfile;
  }
  fprintf(local_60,"sps->constraint_set2_flag: %d \n",(ulong)(uint)sps->constraint_set2_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_68 = _stdout;
  }
  else {
    local_68 = (FILE *)h264_dbgfile;
  }
  fprintf(local_68,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set3_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_70 = _stdout;
  }
  else {
    local_70 = (FILE *)h264_dbgfile;
  }
  fprintf(local_70,"sps->constraint_set3_flag: %d \n",(ulong)(uint)sps->constraint_set3_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_78 = _stdout;
  }
  else {
    local_78 = (FILE *)h264_dbgfile;
  }
  fprintf(local_78,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set4_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_80 = _stdout;
  }
  else {
    local_80 = (FILE *)h264_dbgfile;
  }
  fprintf(local_80,"sps->constraint_set4_flag: %d \n",(ulong)(uint)sps->constraint_set4_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_88 = _stdout;
  }
  else {
    local_88 = (FILE *)h264_dbgfile;
  }
  fprintf(local_88,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->constraint_set5_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_90 = _stdout;
  }
  else {
    local_90 = (FILE *)h264_dbgfile;
  }
  fprintf(local_90,"sps->constraint_set5_flag: %d \n",(ulong)(uint)sps->constraint_set5_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_98 = _stdout;
  }
  else {
    local_98 = (FILE *)h264_dbgfile;
  }
  fprintf(local_98,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u(b,2);
  if (h264_dbgfile == (FILE *)0x0) {
    local_a0 = _stdout;
  }
  else {
    local_a0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_a0,"reserved_zero_2bits: %d \n",(ulong)uVar1);
  if (h264_dbgfile == (FILE *)0x0) {
    local_a8 = _stdout;
  }
  else {
    local_a8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_a8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u8(b);
  sps->level_idc = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_b0 = _stdout;
  }
  else {
    local_b0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_b0,"sps->level_idc: %d \n",(ulong)(uint)sps->level_idc);
  if (h264_dbgfile == (FILE *)0x0) {
    local_b8 = _stdout;
  }
  else {
    local_b8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_b8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->seq_parameter_set_id = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_c0 = _stdout;
  }
  else {
    local_c0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_c0,"sps->seq_parameter_set_id: %d \n",(ulong)(uint)sps->seq_parameter_set_id);
  if (((((sps->profile_idc == 100) || (sps->profile_idc == 0x6e)) || (sps->profile_idc == 0x7a)) ||
      ((((sps->profile_idc == 0xf4 || (sps->profile_idc == 0x2c)) ||
        ((sps->profile_idc == 0x53 || ((sps->profile_idc == 0x56 || (sps->profile_idc == 0x76))))))
       || (sps->profile_idc == 0x80)))) ||
     (((sps->profile_idc == 0x8a || (sps->profile_idc == 0x8b)) || (sps->profile_idc == 0x86)))) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_c8 = _stdout;
    }
    else {
      local_c8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_c8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->chroma_format_idc = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_d0 = _stdout;
    }
    else {
      local_d0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_d0,"sps->chroma_format_idc: %d \n",(ulong)(uint)sps->chroma_format_idc);
    if (sps->chroma_format_idc == 3) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_d8 = _stdout;
      }
      else {
        local_d8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_d8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u1(b);
      sps->residual_colour_transform_flag = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_e0 = _stdout;
      }
      else {
        local_e0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_e0,"sps->residual_colour_transform_flag: %d \n",
              (ulong)(uint)sps->residual_colour_transform_flag);
    }
    if (h264_dbgfile == (FILE *)0x0) {
      local_e8 = _stdout;
    }
    else {
      local_e8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_e8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->bit_depth_luma_minus8 = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_f0 = _stdout;
    }
    else {
      local_f0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_f0,"sps->bit_depth_luma_minus8: %d \n",(ulong)(uint)sps->bit_depth_luma_minus8);
    if (h264_dbgfile == (FILE *)0x0) {
      local_f8 = _stdout;
    }
    else {
      local_f8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_f8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_100 = _stdout;
    }
    else {
      local_100 = (FILE *)h264_dbgfile;
    }
    fprintf(local_100,"sps->bit_depth_chroma_minus8: %d \n",
            (ulong)(uint)sps->bit_depth_chroma_minus8);
    if (h264_dbgfile == (FILE *)0x0) {
      local_108 = _stdout;
    }
    else {
      local_108 = (FILE *)h264_dbgfile;
    }
    fprintf(local_108,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    sps->qpprime_y_zero_transform_bypass_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_110 = _stdout;
    }
    else {
      local_110 = (FILE *)h264_dbgfile;
    }
    fprintf(local_110,"sps->qpprime_y_zero_transform_bypass_flag: %d \n",
            (ulong)(uint)sps->qpprime_y_zero_transform_bypass_flag);
    if (h264_dbgfile == (FILE *)0x0) {
      local_118 = _stdout;
    }
    else {
      local_118 = (FILE *)h264_dbgfile;
    }
    fprintf(local_118,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    sps->seq_scaling_matrix_present_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_120 = _stdout;
    }
    else {
      local_120 = (FILE *)h264_dbgfile;
    }
    fprintf(local_120,"sps->seq_scaling_matrix_present_flag: %d \n",
            (ulong)(uint)sps->seq_scaling_matrix_present_flag);
    if (sps->seq_scaling_matrix_present_flag != 0) {
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_128 = _stdout;
        }
        else {
          local_128 = (FILE *)h264_dbgfile;
        }
        fprintf(local_128,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar1 = bs_read_u1(b);
        sps->seq_scaling_list_present_flag[local_1c] = uVar1;
        if (h264_dbgfile == (FILE *)0x0) {
          local_130 = _stdout;
        }
        else {
          local_130 = (FILE *)h264_dbgfile;
        }
        fprintf(local_130,"sps->seq_scaling_list_present_flag[ i ]: %d \n",
                (ulong)(uint)sps->seq_scaling_list_present_flag[local_1c]);
        if (sps->seq_scaling_list_present_flag[local_1c] != 0) {
          if (local_1c < 6) {
            read_debug_scaling_list
                      (b,sps->ScalingList4x4[local_1c],0x10,
                       sps->UseDefaultScalingMatrix4x4Flag + local_1c);
          }
          else {
            read_debug_scaling_list
                      (b,sps->ScalingList8x8[local_1c + -6],0x40,
                       sps->UseDefaultScalingMatrix8x8Flag + (local_1c + -6));
          }
        }
      }
    }
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_138 = _stdout;
  }
  else {
    local_138 = (FILE *)h264_dbgfile;
  }
  fprintf(local_138,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->log2_max_frame_num_minus4 = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_140 = _stdout;
  }
  else {
    local_140 = (FILE *)h264_dbgfile;
  }
  fprintf(local_140,"sps->log2_max_frame_num_minus4: %d \n",
          (ulong)(uint)sps->log2_max_frame_num_minus4);
  if (h264_dbgfile == (FILE *)0x0) {
    local_148 = _stdout;
  }
  else {
    local_148 = (FILE *)h264_dbgfile;
  }
  fprintf(local_148,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->pic_order_cnt_type = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_150 = _stdout;
  }
  else {
    local_150 = (FILE *)h264_dbgfile;
  }
  fprintf(local_150,"sps->pic_order_cnt_type: %d \n",(ulong)(uint)sps->pic_order_cnt_type);
  if (sps->pic_order_cnt_type == 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_158 = _stdout;
    }
    else {
      local_158 = (FILE *)h264_dbgfile;
    }
    fprintf(local_158,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->log2_max_pic_order_cnt_lsb_minus4 = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_160 = _stdout;
    }
    else {
      local_160 = (FILE *)h264_dbgfile;
    }
    fprintf(local_160,"sps->log2_max_pic_order_cnt_lsb_minus4: %d \n",
            (ulong)(uint)sps->log2_max_pic_order_cnt_lsb_minus4);
  }
  else if (sps->pic_order_cnt_type == 1) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_168 = _stdout;
    }
    else {
      local_168 = (FILE *)h264_dbgfile;
    }
    fprintf(local_168,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    sps->delta_pic_order_always_zero_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_170 = _stdout;
    }
    else {
      local_170 = (FILE *)h264_dbgfile;
    }
    fprintf(local_170,"sps->delta_pic_order_always_zero_flag: %d \n",
            (ulong)(uint)sps->delta_pic_order_always_zero_flag);
    if (h264_dbgfile == (FILE *)0x0) {
      local_178 = _stdout;
    }
    else {
      local_178 = (FILE *)h264_dbgfile;
    }
    fprintf(local_178,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar2 = bs_read_se(b);
    sps->offset_for_non_ref_pic = iVar2;
    if (h264_dbgfile == (FILE *)0x0) {
      local_180 = _stdout;
    }
    else {
      local_180 = (FILE *)h264_dbgfile;
    }
    fprintf(local_180,"sps->offset_for_non_ref_pic: %d \n",(ulong)(uint)sps->offset_for_non_ref_pic)
    ;
    if (h264_dbgfile == (FILE *)0x0) {
      local_188 = _stdout;
    }
    else {
      local_188 = (FILE *)h264_dbgfile;
    }
    fprintf(local_188,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar2 = bs_read_se(b);
    sps->offset_for_top_to_bottom_field = iVar2;
    if (h264_dbgfile == (FILE *)0x0) {
      local_190 = _stdout;
    }
    else {
      local_190 = (FILE *)h264_dbgfile;
    }
    fprintf(local_190,"sps->offset_for_top_to_bottom_field: %d \n",
            (ulong)(uint)sps->offset_for_top_to_bottom_field);
    if (h264_dbgfile == (FILE *)0x0) {
      local_198 = _stdout;
    }
    else {
      local_198 = (FILE *)h264_dbgfile;
    }
    fprintf(local_198,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1a0 = _stdout;
    }
    else {
      local_1a0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1a0,"sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n",
            (ulong)(uint)sps->num_ref_frames_in_pic_order_cnt_cycle);
    for (local_1c = 0; local_1c < sps->num_ref_frames_in_pic_order_cnt_cycle;
        local_1c = local_1c + 1) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_1a8 = _stdout;
      }
      else {
        local_1a8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1a8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar2 = bs_read_se(b);
      sps->offset_for_ref_frame[local_1c] = iVar2;
      if (h264_dbgfile == (FILE *)0x0) {
        local_1b0 = _stdout;
      }
      else {
        local_1b0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1b0,"sps->offset_for_ref_frame[ i ]: %d \n",
              (ulong)(uint)sps->offset_for_ref_frame[local_1c]);
    }
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_1b8 = _stdout;
  }
  else {
    local_1b8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1b8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->num_ref_frames = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1c0 = _stdout;
  }
  else {
    local_1c0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1c0,"sps->num_ref_frames: %d \n",(ulong)(uint)sps->num_ref_frames);
  if (h264_dbgfile == (FILE *)0x0) {
    local_1c8 = _stdout;
  }
  else {
    local_1c8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1c8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->gaps_in_frame_num_value_allowed_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1d0 = _stdout;
  }
  else {
    local_1d0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1d0,"sps->gaps_in_frame_num_value_allowed_flag: %d \n",
          (ulong)(uint)sps->gaps_in_frame_num_value_allowed_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_1d8 = _stdout;
  }
  else {
    local_1d8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1d8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->pic_width_in_mbs_minus1 = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1e0 = _stdout;
  }
  else {
    local_1e0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1e0,"sps->pic_width_in_mbs_minus1: %d \n",(ulong)(uint)sps->pic_width_in_mbs_minus1)
  ;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1e8 = _stdout;
  }
  else {
    local_1e8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1e8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_ue(b);
  sps->pic_height_in_map_units_minus1 = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1f0 = _stdout;
  }
  else {
    local_1f0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1f0,"sps->pic_height_in_map_units_minus1: %d \n",
          (ulong)(uint)sps->pic_height_in_map_units_minus1);
  if (h264_dbgfile == (FILE *)0x0) {
    local_1f8 = _stdout;
  }
  else {
    local_1f8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1f8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->frame_mbs_only_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_200 = _stdout;
  }
  else {
    local_200 = (FILE *)h264_dbgfile;
  }
  fprintf(local_200,"sps->frame_mbs_only_flag: %d \n",(ulong)(uint)sps->frame_mbs_only_flag);
  if (sps->frame_mbs_only_flag == 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_208 = _stdout;
    }
    else {
      local_208 = (FILE *)h264_dbgfile;
    }
    fprintf(local_208,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    sps->mb_adaptive_frame_field_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_210 = _stdout;
    }
    else {
      local_210 = (FILE *)h264_dbgfile;
    }
    fprintf(local_210,"sps->mb_adaptive_frame_field_flag: %d \n",
            (ulong)(uint)sps->mb_adaptive_frame_field_flag);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_218 = _stdout;
  }
  else {
    local_218 = (FILE *)h264_dbgfile;
  }
  fprintf(local_218,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->direct_8x8_inference_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_220 = _stdout;
  }
  else {
    local_220 = (FILE *)h264_dbgfile;
  }
  fprintf(local_220,"sps->direct_8x8_inference_flag: %d \n",
          (ulong)(uint)sps->direct_8x8_inference_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_228 = _stdout;
  }
  else {
    local_228 = (FILE *)h264_dbgfile;
  }
  fprintf(local_228,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->frame_cropping_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_230 = _stdout;
  }
  else {
    local_230 = (FILE *)h264_dbgfile;
  }
  fprintf(local_230,"sps->frame_cropping_flag: %d \n",(ulong)(uint)sps->frame_cropping_flag);
  if (sps->frame_cropping_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_238 = _stdout;
    }
    else {
      local_238 = (FILE *)h264_dbgfile;
    }
    fprintf(local_238,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->frame_crop_left_offset = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_240 = _stdout;
    }
    else {
      local_240 = (FILE *)h264_dbgfile;
    }
    fprintf(local_240,"sps->frame_crop_left_offset: %d \n",(ulong)(uint)sps->frame_crop_left_offset)
    ;
    if (h264_dbgfile == (FILE *)0x0) {
      local_248 = _stdout;
    }
    else {
      local_248 = (FILE *)h264_dbgfile;
    }
    fprintf(local_248,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->frame_crop_right_offset = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_250 = _stdout;
    }
    else {
      local_250 = (FILE *)h264_dbgfile;
    }
    fprintf(local_250,"sps->frame_crop_right_offset: %d \n",
            (ulong)(uint)sps->frame_crop_right_offset);
    if (h264_dbgfile == (FILE *)0x0) {
      local_258 = _stdout;
    }
    else {
      local_258 = (FILE *)h264_dbgfile;
    }
    fprintf(local_258,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->frame_crop_top_offset = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_260 = _stdout;
    }
    else {
      local_260 = (FILE *)h264_dbgfile;
    }
    fprintf(local_260,"sps->frame_crop_top_offset: %d \n",(ulong)(uint)sps->frame_crop_top_offset);
    if (h264_dbgfile == (FILE *)0x0) {
      local_268 = _stdout;
    }
    else {
      local_268 = (FILE *)h264_dbgfile;
    }
    fprintf(local_268,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    sps->frame_crop_bottom_offset = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_270 = _stdout;
    }
    else {
      local_270 = (FILE *)h264_dbgfile;
    }
    fprintf(local_270,"sps->frame_crop_bottom_offset: %d \n",
            (ulong)(uint)sps->frame_crop_bottom_offset);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_278 = _stdout;
  }
  else {
    local_278 = (FILE *)h264_dbgfile;
  }
  fprintf(local_278,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  sps->vui_parameters_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_280 = _stdout;
  }
  else {
    local_280 = (FILE *)h264_dbgfile;
  }
  fprintf(local_280,"sps->vui_parameters_present_flag: %d \n",
          (ulong)(uint)sps->vui_parameters_present_flag);
  if (sps->vui_parameters_present_flag != 0) {
    read_debug_vui_parameters(sps,b);
  }
  return;
}

Assistant:

void read_debug_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->profile_idc = bs_read_u8(b); printf("sps->profile_idc: %d \n", sps->profile_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set0_flag = bs_read_u1(b); printf("sps->constraint_set0_flag: %d \n", sps->constraint_set0_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set1_flag = bs_read_u1(b); printf("sps->constraint_set1_flag: %d \n", sps->constraint_set1_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set2_flag = bs_read_u1(b); printf("sps->constraint_set2_flag: %d \n", sps->constraint_set2_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set3_flag = bs_read_u1(b); printf("sps->constraint_set3_flag: %d \n", sps->constraint_set3_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set4_flag = bs_read_u1(b); printf("sps->constraint_set4_flag: %d \n", sps->constraint_set4_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set5_flag = bs_read_u1(b); printf("sps->constraint_set5_flag: %d \n", sps->constraint_set5_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int reserved_zero_2bits = bs_read_u(b, 2); printf("reserved_zero_2bits: %d \n", reserved_zero_2bits); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->level_idc = bs_read_u8(b); printf("sps->level_idc: %d \n", sps->level_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_parameter_set_id = bs_read_ue(b); printf("sps->seq_parameter_set_id: %d \n", sps->seq_parameter_set_id); 

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->chroma_format_idc = bs_read_ue(b); printf("sps->chroma_format_idc: %d \n", sps->chroma_format_idc); 
        if( sps->chroma_format_idc == 3 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->residual_colour_transform_flag = bs_read_u1(b); printf("sps->residual_colour_transform_flag: %d \n", sps->residual_colour_transform_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_luma_minus8 = bs_read_ue(b); printf("sps->bit_depth_luma_minus8: %d \n", sps->bit_depth_luma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_chroma_minus8 = bs_read_ue(b); printf("sps->bit_depth_chroma_minus8: %d \n", sps->bit_depth_chroma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b); printf("sps->qpprime_y_zero_transform_bypass_flag: %d \n", sps->qpprime_y_zero_transform_bypass_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_matrix_present_flag = bs_read_u1(b); printf("sps->seq_scaling_matrix_present_flag: %d \n", sps->seq_scaling_matrix_present_flag); 
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < 8; i++ )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b); printf("sps->seq_scaling_list_present_flag[ i ]: %d \n", sps->seq_scaling_list_present_flag[ i ]); 
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_debug_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_debug_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_frame_num_minus4 = bs_read_ue(b); printf("sps->log2_max_frame_num_minus4: %d \n", sps->log2_max_frame_num_minus4); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_order_cnt_type = bs_read_ue(b); printf("sps->pic_order_cnt_type: %d \n", sps->pic_order_cnt_type); 
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b); printf("sps->log2_max_pic_order_cnt_lsb_minus4: %d \n", sps->log2_max_pic_order_cnt_lsb_minus4); 
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->delta_pic_order_always_zero_flag = bs_read_u1(b); printf("sps->delta_pic_order_always_zero_flag: %d \n", sps->delta_pic_order_always_zero_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_non_ref_pic = bs_read_se(b); printf("sps->offset_for_non_ref_pic: %d \n", sps->offset_for_non_ref_pic); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_top_to_bottom_field = bs_read_se(b); printf("sps->offset_for_top_to_bottom_field: %d \n", sps->offset_for_top_to_bottom_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b); printf("sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n", sps->num_ref_frames_in_pic_order_cnt_cycle); 
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_ref_frame[ i ] = bs_read_se(b); printf("sps->offset_for_ref_frame[ i ]: %d \n", sps->offset_for_ref_frame[ i ]); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames = bs_read_ue(b); printf("sps->num_ref_frames: %d \n", sps->num_ref_frames); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b); printf("sps->gaps_in_frame_num_value_allowed_flag: %d \n", sps->gaps_in_frame_num_value_allowed_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_width_in_mbs_minus1 = bs_read_ue(b); printf("sps->pic_width_in_mbs_minus1: %d \n", sps->pic_width_in_mbs_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_height_in_map_units_minus1 = bs_read_ue(b); printf("sps->pic_height_in_map_units_minus1: %d \n", sps->pic_height_in_map_units_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_mbs_only_flag = bs_read_u1(b); printf("sps->frame_mbs_only_flag: %d \n", sps->frame_mbs_only_flag); 
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->mb_adaptive_frame_field_flag = bs_read_u1(b); printf("sps->mb_adaptive_frame_field_flag: %d \n", sps->mb_adaptive_frame_field_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->direct_8x8_inference_flag = bs_read_u1(b); printf("sps->direct_8x8_inference_flag: %d \n", sps->direct_8x8_inference_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_cropping_flag = bs_read_u1(b); printf("sps->frame_cropping_flag: %d \n", sps->frame_cropping_flag); 
    if( sps->frame_cropping_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_left_offset = bs_read_ue(b); printf("sps->frame_crop_left_offset: %d \n", sps->frame_crop_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_right_offset = bs_read_ue(b); printf("sps->frame_crop_right_offset: %d \n", sps->frame_crop_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_top_offset = bs_read_ue(b); printf("sps->frame_crop_top_offset: %d \n", sps->frame_crop_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_bottom_offset = bs_read_ue(b); printf("sps->frame_crop_bottom_offset: %d \n", sps->frame_crop_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui_parameters_present_flag = bs_read_u1(b); printf("sps->vui_parameters_present_flag: %d \n", sps->vui_parameters_present_flag); 
    if( sps->vui_parameters_present_flag )
    {
        read_debug_vui_parameters(sps, b);
    }
}